

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

void __thiscall
Js::JSONStringifier::AddToPropertyList
          (JSONStringifier *this,Var item,BVSparse<Memory::Recycler> *propertyBV)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *this_00;
  ulong uVar7;
  JavascriptString *propertyString;
  undefined1 auStack_48 [8];
  PropertyListElement elem;
  PropertyRecord *propertyRecord;
  
  if (item == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00b65e27;
    *puVar6 = 0;
LAB_00b65c6a:
    this_00 = UnsafeVarTo<Js::RecyclableObject>(item);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00b65e27;
      *puVar6 = 0;
    }
    TVar1 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this_00), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_00b65e27:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    if (TypeIds_StringObject < TVar1) {
      return;
    }
    uVar7 = (ulong)TVar1;
    if ((0xc000000070U >> (uVar7 & 0x3f) & 1) != 0) {
LAB_00b65d96:
      propertyString = JavascriptConversion::ToString(item,this->scriptContext);
      goto LAB_00b65da1;
    }
    if (uVar7 != 3) {
      if (uVar7 != 7) {
        return;
      }
      propertyString = UnsafeVarTo<Js::JavascriptString>(item);
      goto LAB_00b65da1;
    }
  }
  else if (((ulong)item & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)item & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)item & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)item >> 0x32 == 0) goto LAB_00b65c6a;
      goto LAB_00b65d96;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00b65e27;
    *puVar6 = 0;
  }
  propertyString = ScriptContext::GetIntegerString(this->scriptContext,item);
LAB_00b65da1:
  if (propertyString != (JavascriptString *)0x0) {
    ScriptContext::GetOrAddPropertyRecord
              (this->scriptContext,propertyString,(PropertyRecord **)&elem.propertyName);
    BVar4 = BVSparse<Memory::Recycler>::TestAndSet
                      (propertyBV,
                       *(BVIndex *)&((elem.propertyName.ptr)->super_RecyclableObject).type.ptr);
    if (BVar4 == '\0') {
      auStack_48 = (undefined1  [8])0x0;
      elem.propertyRecord.ptr = (PropertyRecord *)0x0;
      Memory::Recycler::WBSetBit((char *)&elem);
      elem.propertyRecord.ptr = (PropertyRecord *)propertyString;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&elem);
      Memory::Recycler::WBSetBit((char *)auStack_48);
      auStack_48 = (undefined1  [8])elem.propertyName.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier((PropertyListElement *)auStack_48);
      SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::Prepend
                (&this->propertyList->
                  super_SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>
                 ,this->propertyList->allocator,(PropertyListElement *)auStack_48);
    }
  }
  return;
}

Assistant:

void
JSONStringifier::AddToPropertyList(_In_ Var item, _Inout_ BVSparse<Recycler>* propertyBV)
{
    JavascriptString* propertyName = nullptr;
    switch (JavascriptOperators::GetTypeId(item))
    {
    case TypeIds_Integer:
        propertyName = this->scriptContext->GetIntegerString(item);
        break;
    case TypeIds_String:
        propertyName = UnsafeVarTo<JavascriptString>(item);
        break;
    case TypeIds_Number:
    case TypeIds_NumberObject:
    case TypeIds_Int64Number:
    case TypeIds_UInt64Number:
    case TypeIds_StringObject:
        propertyName = JavascriptConversion::ToString(item, this->scriptContext);
        break;
    default:
        break;
    }

    if (propertyName != nullptr)
    {
        PropertyRecord const* propertyRecord;
        scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
        if(!propertyBV->TestAndSet(propertyRecord->GetPropertyId()))
        {
            PropertyListElement elem;
            elem.propertyName = propertyName;
            elem.propertyRecord = propertyRecord;
            this->propertyList->Push(elem);
        }
    }
}